

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void login_log(CHAR_DATA *ch,int type)

{
  time_t tVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  char query [4608];
  
  pcVar6 = ch->pcdata->host;
  if (pcVar6 == (char *)0x0) {
    if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
      return;
    }
    if ((ch->comm[0] & 0x8000000) != 0) {
      return;
    }
    pcVar6 = ch->desc->host;
  }
  else if ((ch->comm[0] & 0x8000000) != 0) {
    return;
  }
  pcVar3 = escape_string(pcVar6);
  pcVar6 = ch->true_name;
  pcVar4 = log_time();
  tVar1 = current_time;
  if (type == 2) {
    lVar5 = (current_time - ch->logon) / 0x3c;
  }
  else {
    lVar5 = -1;
    if (type < 1) {
      uVar8 = 0xffffffffffffffff;
      uVar7 = 0xffffffff;
      goto LAB_002a030b;
    }
  }
  uVar2 = count_carried(ch,false);
  uVar8 = (ulong)uVar2;
  uVar2 = count_carried(ch,true);
  uVar7 = (ulong)uVar2;
LAB_002a030b:
  sprintf(query,
          "INSERT INTO logins VALUES(\'%s\', \'%s\', \'%s\', \'%ld\', \'%ld\', \'%d\', \'%d\', \'%d\')"
          ,pcVar6,pcVar3,pcVar4,tVar1,lVar5,uVar8,uVar7,type);
  one_query(query);
  return;
}

Assistant:

void login_log(CHAR_DATA *ch, int type)
{
	if (!ch->pcdata->host && !ch->desc)
		return;

	if (IS_SET(ch->comm, COMM_NOSOCKET))
		return;

	auto escape = ch->pcdata->host
					  ? escape_string(ch->pcdata->host)
					  : escape_string(ch->desc->host);

	char query[MAX_STRING_LENGTH];
	sprintf(query, "INSERT INTO logins VALUES('%s', '%s', '%s', '%ld', '%ld', '%d', '%d', '%d')",
			ch->true_name,
			escape,
			log_time(),
			current_time,
			type == 2 ? ((current_time - ch->logon) / 60) : -1,
			type > 0 ? count_carried(ch, false) : -1, type > 0 ? count_carried(ch, true) : -1,
			type);

	one_query(query);
}